

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O0

void vkt::anon_unknown_0::pushRenderPassCommands
               (DeviceInterface *vk,VkCommandBuffer commandBuffer,VkRenderPass renderPass,
               VkFramebuffer framebuffer,
               vector<de::SharedPtr<vkt::(anonymous_namespace)::SubpassRenderer>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::SubpassRenderer>_>_>
               *subpassRenderers,UVec2 *renderPos,UVec2 *renderSize,
               vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               *renderPassClearValues,RenderTypes render)

{
  VkRect2D pRenderPassBegin_renderArea;
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  const_reference pvVar4;
  VkClearValue *__x;
  const_reference pvVar5;
  SubpassRenderer *pSVar6;
  VkClearValue VVar7;
  deInt32 in_stack_fffffffffffffecc;
  undefined4 in_stack_fffffffffffffedc;
  VkCommandBuffer in_stack_fffffffffffffee0;
  VkExtent2D local_118;
  VkCommandBuffer local_d0;
  VkCommandBuffer cmd;
  undefined8 local_c0;
  VkRenderPass local_b8;
  VkCommandBuffer local_b0;
  uint local_a4;
  ulong uStack_a0;
  VkSubpassContents contents;
  size_t subpassNdx;
  uint uStack_90;
  VkRect2D renderArea;
  ulong local_68;
  size_t attachmentNdx;
  vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> attachmentClearValues;
  float clearNan;
  UVec2 *renderPos_local;
  vector<de::SharedPtr<vkt::(anonymous_namespace)::SubpassRenderer>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::SubpassRenderer>_>_>
  *subpassRenderers_local;
  VkCommandBuffer commandBuffer_local;
  DeviceInterface *vk_local;
  VkFramebuffer framebuffer_local;
  VkRenderPass renderPass_local;
  
  tcu::Float<unsigned_int,_8,_23,_127,_3U>::nan((char *)vk);
  attachmentClearValues.super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
       tcu::Float<unsigned_int,_8,_23,_127,_3U>::asFloat
                 ((Float<unsigned_int,_8,_23,_127,_3U> *)
                  &attachmentClearValues.
                   super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage);
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::vector
            ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)&attachmentNdx);
  for (local_68 = 0;
      sVar3 = std::
              vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>::
              size(renderPassClearValues), local_68 < sVar3; local_68 = local_68 + 1) {
    pvVar4 = std::
             vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>::
             operator[](renderPassClearValues,local_68);
    bVar2 = tcu::Maybe::operator_cast_to_bool((Maybe *)pvVar4);
    if (bVar2) {
      pvVar4 = std::
               vector<tcu::Maybe<vk::VkClearValue>,_std::allocator<tcu::Maybe<vk::VkClearValue>_>_>
               ::operator[](renderPassClearValues,local_68);
      __x = tcu::Maybe<vk::VkClearValue>::operator*(pvVar4);
      std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::push_back
                ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)&attachmentNdx,__x);
    }
    else {
      VVar7 = ::vk::makeClearValueColorF32
                        (attachmentClearValues.
                         super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                         attachmentClearValues.
                         super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                         attachmentClearValues.
                         super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,
                         attachmentClearValues.
                         super__Vector_base<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      renderArea.extent = (VkExtent2D)VVar7.depthStencil;
      std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::push_back
                ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)&attachmentNdx,
                 (value_type *)&renderArea.extent);
    }
  }
  subpassNdx._4_4_ = tcu::Vector<unsigned_int,_2>::x(renderPos);
  uStack_90 = tcu::Vector<unsigned_int,_2>::y(renderPos);
  renderArea.offset.x = tcu::Vector<unsigned_int,_2>::x(renderSize);
  renderArea.offset.y = tcu::Vector<unsigned_int,_2>::y(renderSize);
  for (uStack_a0 = 0; uVar1 = uStack_a0,
      sVar3 = std::
              vector<de::SharedPtr<vkt::(anonymous_namespace)::SubpassRenderer>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::SubpassRenderer>_>_>
              ::size(subpassRenderers), uVar1 < sVar3; uStack_a0 = uStack_a0 + 1) {
    pvVar5 = std::
             vector<de::SharedPtr<vkt::(anonymous_namespace)::SubpassRenderer>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::SubpassRenderer>_>_>
             ::operator[](subpassRenderers,uStack_a0);
    pSVar6 = de::SharedPtr<vkt::(anonymous_namespace)::SubpassRenderer>::operator->(pvVar5);
    bVar2 = SubpassRenderer::isSecondary(pSVar6);
    local_a4 = (uint)bVar2;
    if (uStack_a0 == 0) {
      cmd = (VkCommandBuffer)CONCAT44(uStack_90,subpassNdx._4_4_);
      local_c0 = CONCAT44(renderArea.offset.y,renderArea.offset.x);
      local_b8.m_internal = framebuffer.m_internal;
      local_b0 = (VkCommandBuffer)renderPass.m_internal;
      sVar3 = std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::size
                        ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)
                         &attachmentNdx);
      bVar2 = std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::empty
                        ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)
                         &attachmentNdx);
      if (bVar2) {
        local_118.width = 0;
        local_118.height = 0;
      }
      else {
        local_118 = (VkExtent2D)
                    std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::operator[]
                              ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)
                               &attachmentNdx,0);
      }
      pRenderPassBegin_renderArea.offset.y = in_stack_fffffffffffffecc;
      pRenderPassBegin_renderArea.offset.x = (deInt32)sVar3;
      pRenderPassBegin_renderArea.extent = local_118;
      cmdBeginRenderPass((anon_unknown_0 *)vk,(DeviceInterface *)commandBuffer,local_b0,local_b8,
                         (VkFramebuffer)cmd,pRenderPassBegin_renderArea,(deUint32)local_c0,
                         (VkClearValue *)CONCAT44(in_stack_fffffffffffffedc,local_a4),
                         (VkSubpassContents)in_stack_fffffffffffffee0);
    }
    else {
      (*vk->_vptr_DeviceInterface[0x75])(vk,commandBuffer,(ulong)local_a4);
    }
    if (render != RENDERTYPES_NONE) {
      if (local_a4 == 0) {
        pvVar5 = std::
                 vector<de::SharedPtr<vkt::(anonymous_namespace)::SubpassRenderer>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::SubpassRenderer>_>_>
                 ::operator[](subpassRenderers,uStack_a0);
        pSVar6 = de::SharedPtr<vkt::(anonymous_namespace)::SubpassRenderer>::operator->(pvVar5);
        SubpassRenderer::pushRenderCommands(pSVar6,vk,commandBuffer);
      }
      else if (local_a4 == 1) {
        pvVar5 = std::
                 vector<de::SharedPtr<vkt::(anonymous_namespace)::SubpassRenderer>,_std::allocator<de::SharedPtr<vkt::(anonymous_namespace)::SubpassRenderer>_>_>
                 ::operator[](subpassRenderers,uStack_a0);
        pSVar6 = de::SharedPtr<vkt::(anonymous_namespace)::SubpassRenderer>::operator->(pvVar5);
        in_stack_fffffffffffffee0 = SubpassRenderer::getCommandBuffer(pSVar6);
        local_d0 = in_stack_fffffffffffffee0;
        (*vk->_vptr_DeviceInterface[0x77])(vk,commandBuffer,1,&local_d0);
      }
    }
  }
  (*vk->_vptr_DeviceInterface[0x76])(vk,commandBuffer);
  std::vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_>::~vector
            ((vector<vk::VkClearValue,_std::allocator<vk::VkClearValue>_> *)&attachmentNdx);
  return;
}

Assistant:

void pushRenderPassCommands (const DeviceInterface&							vk,
							 VkCommandBuffer								commandBuffer,
							 VkRenderPass									renderPass,
							 VkFramebuffer									framebuffer,
							 const vector<de::SharedPtr<SubpassRenderer> >&	subpassRenderers,
							 const UVec2&									renderPos,
							 const UVec2&									renderSize,
							 const vector<Maybe<VkClearValue> >&			renderPassClearValues,
							 TestConfig::RenderTypes						render)
{
	const float				clearNan				= tcu::Float32::nan().asFloat();
	vector<VkClearValue>	attachmentClearValues;

	for (size_t attachmentNdx = 0; attachmentNdx < renderPassClearValues.size(); attachmentNdx++)
	{
		if (renderPassClearValues[attachmentNdx])
			attachmentClearValues.push_back(*renderPassClearValues[attachmentNdx]);
		else
			attachmentClearValues.push_back(makeClearValueColorF32(clearNan, clearNan, clearNan, clearNan));
	}

	{
		const VkRect2D renderArea =
		{
			{ (deInt32)renderPos.x(),	(deInt32)renderPos.y()	},
			{ renderSize.x(),			renderSize.y()			}
		};

		for (size_t subpassNdx = 0; subpassNdx < subpassRenderers.size(); subpassNdx++)
		{
			const VkSubpassContents	contents = subpassRenderers[subpassNdx]->isSecondary() ? VK_SUBPASS_CONTENTS_SECONDARY_COMMAND_BUFFERS : VK_SUBPASS_CONTENTS_INLINE;

			if (subpassNdx == 0)
				cmdBeginRenderPass(vk, commandBuffer, renderPass, framebuffer, renderArea, (deUint32)attachmentClearValues.size(), attachmentClearValues.empty() ? DE_NULL : &attachmentClearValues[0], contents);
			else
				vk.cmdNextSubpass(commandBuffer, contents);

			if (render)
			{
				if (contents == VK_SUBPASS_CONTENTS_INLINE)
				{
					subpassRenderers[subpassNdx]->pushRenderCommands(vk, commandBuffer);
				}
				else if (contents == VK_SUBPASS_CONTENTS_SECONDARY_COMMAND_BUFFERS)
				{
					const VkCommandBuffer cmd = subpassRenderers[subpassNdx]->getCommandBuffer();
					vk.cmdExecuteCommands(commandBuffer, 1, &cmd);
				}
				else
					DE_FATAL("Invalid contents");
			}
		}

		vk.cmdEndRenderPass(commandBuffer);
	}
}